

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCException.h
# Opt level: O1

ExceptionReporter<GenICam_3_4::LogicalErrorException> * __thiscall
GenICam_3_4::ExceptionReporter<GenICam_3_4::LogicalErrorException>::Report
          (ExceptionReporter<GenICam_3_4::LogicalErrorException> *this,char *pFormat,...)

{
  int iVar1;
  char in_AL;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vap;
  char pBuffer [2048];
  undefined8 local_8f8;
  void **local_8f0;
  undefined1 *local_8e8;
  undefined1 local_8d8 [24];
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  char local_828 [2048];
  
  local_8e8 = local_8d8;
  if (in_AL != '\0') {
    local_8a8 = in_XMM0_Qa;
    local_898 = in_XMM1_Qa;
    local_888 = in_XMM2_Qa;
    local_878 = in_XMM3_Qa;
    local_868 = in_XMM4_Qa;
    local_858 = in_XMM5_Qa;
    local_848 = in_XMM6_Qa;
    local_838 = in_XMM7_Qa;
  }
  local_8f0 = &vap[0].overflow_arg_area;
  local_8f8 = 0x3000000018;
  local_8c0 = in_RCX;
  local_8b8 = in_R8;
  local_8b0 = in_R9;
  vsnprintf(local_828,0x800,in_RDX,&local_8f8);
  pcVar2 = (char *)GenICam_3_4::gcstring::c_str();
  iVar1 = *(int *)(pFormat + 0x50);
  pcVar3 = (char *)GenICam_3_4::gcstring::c_str();
  GenICam_3_4::LogicalErrorException::LogicalErrorException
            ((LogicalErrorException *)this,local_828,pcVar2,iVar1,pcVar3);
  return this;
}

Assistant:

E Report(const char* pFormat, ...)
        {
            char pBuffer[2048];
            va_list vap;
            va_start(vap, pFormat);

#               if defined (_MSC_VER)
            vsnprintf_s(pBuffer, sizeof pBuffer, _TRUNCATE, pFormat, vap);
#               else 
            vsnprintf( pBuffer, sizeof pBuffer, pFormat, vap );
#               endif 

            va_end(vap);

            return E(pBuffer, m_SourceFileName.c_str(), m_SourceLine, m_ExceptionType.c_str());
        }